

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args;
  SyntaxNode *args_1;
  SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *args_3;
  CheckerInstantiationSyntax *pCVar1;
  DeepCloneVisitor visitor;
  Token local_48;
  ParameterValueAssignmentSyntax *local_38;
  
  args = deepClone<slang::syntax::AttributeInstanceSyntax>
                   ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)(__fn + 0x18),
                    (BumpAllocator *)__child_stack);
  args_1 = detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x50),(DeepCloneVisitor *)&local_48,
                      (BumpAllocator *)__child_stack);
  if (*(SyntaxNode **)(__fn + 0x58) == (SyntaxNode *)0x0) {
    local_38 = (ParameterValueAssignmentSyntax *)0x0;
  }
  else {
    local_38 = (ParameterValueAssignmentSyntax *)
               detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x58),(DeepCloneVisitor *)&local_48,
                          (BumpAllocator *)__child_stack);
  }
  args_3 = deepClone<slang::syntax::HierarchicalInstanceSyntax>
                     ((SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *)
                      (__fn + 0x60),(BumpAllocator *)__child_stack);
  local_48 = parsing::Token::deepClone((Token *)(__fn + 0x98),(BumpAllocator *)__child_stack);
  pCVar1 = BumpAllocator::
           emplace<slang::syntax::CheckerInstantiationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::syntax::NameSyntax&,slang::syntax::ParameterValueAssignmentSyntax*,slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>&,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,args,(NameSyntax *)args_1,&local_38,args_3,
                      &local_48);
  return (int)pCVar1;
}

Assistant:

static SyntaxNode* clone(const CheckerInstantiationSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<CheckerInstantiationSyntax>(
        *deepClone(node.attributes, alloc),
        *deepClone<NameSyntax>(*node.type, alloc),
        node.parameters ? deepClone(*node.parameters, alloc) : nullptr,
        *deepClone(node.instances, alloc),
        node.semi.deepClone(alloc)
    );
}